

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::startDrag(QAbstractItemView *this,DropActions supportedActions)

{
  QAbstractItemViewPrivate *this_00;
  QFlagsStorage<Qt::DropAction> QVar1;
  int iVar2;
  int iVar3;
  DragDropMode DVar4;
  long lVar5;
  QPoint *this_01;
  QWidget *pQVar6;
  QWidget *pQVar7;
  DropAction DVar8;
  long in_FS_OFFSET;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  QModelIndexList local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemViewPrivate::selectedDraggableIndexes(&local_58,this_00);
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) goto LAB_0053b7a7;
  lVar5 = (**(code **)(*(long *)this_00->model + 0xd0))(this_00->model,&local_58);
  if (lVar5 == 0) goto LAB_0053b7a7;
  local_68 = 0;
  uStack_60 = 0xffffffffffffffff;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemViewPrivate::renderToPixmap
            ((QAbstractItemViewPrivate *)local_88,(QModelIndexList *)this_00,(QRect *)&local_58);
  iVar2 = (**(code **)(*(long *)this + 0x2b0))(this);
  iVar3 = (**(code **)(*(long *)this + 0x2b8))(this);
  local_68._4_4_ = local_68._4_4_ + iVar3;
  local_68._0_4_ = (int)local_68 + iVar2;
  this_01 = (QPoint *)operator_new(0x10);
  QDrag::QDrag((QDrag *)this_01,(QObject *)this);
  QDrag::setPixmap((QPixmap *)this_01);
  QDrag::setMimeData((QMimeData *)this_01);
  QDrag::setHotSpot(this_01);
  DVar4 = dragDropMode(this);
  QVar1.i = (uint)supportedActions.super_QFlagsStorageHelper<Qt::DropAction,_4>.
                  super_QFlagsStorage<Qt::DropAction>.i & ~CopyAction;
  if (DVar4 != InternalMove) {
    QVar1.i = (Int)supportedActions.super_QFlagsStorageHelper<Qt::DropAction,_4>.
                   super_QFlagsStorage<Qt::DropAction>.i;
  }
  DVar8 = this_00->defaultDropAction;
  if (((QVar1.i & DVar8) == IgnoreAction || DVar8 == IgnoreAction) &&
     (DVar8 = IgnoreAction, (QVar1.i & CopyAction) != IgnoreAction)) {
    DVar4 = dragDropMode(this);
    DVar8 = (DropAction)(DVar4 != InternalMove);
  }
  this_00->dropEventMoved = false;
  iVar2 = QDrag::exec(this_01,QVar1.i,DVar8);
  if ((iVar2 == 2) && (this_00->dropEventMoved == false)) {
    DVar4 = dragDropMode(this);
    if (DVar4 == InternalMove) {
      pQVar6 = (QWidget *)QDrag::target();
      pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      if (pQVar6 != pQVar7) goto LAB_0053b77e;
    }
    QAbstractItemViewPrivate::clearOrRemove(this_00);
  }
LAB_0053b77e:
  this_00->dropEventMoved = false;
  (this_00->dropIndicatorRect).x1 = 0;
  (this_00->dropIndicatorRect).y1 = 0;
  (this_00->dropIndicatorRect).x2 = -1;
  (this_00->dropIndicatorRect).y2 = -1;
  this_00->dropIndicatorPosition = OnItem;
  QPixmap::~QPixmap((QPixmap *)local_88);
LAB_0053b7a7:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::startDrag(Qt::DropActions supportedActions)
{
    Q_D(QAbstractItemView);
    QModelIndexList indexes = d->selectedDraggableIndexes();
    if (indexes.size() > 0) {
        QMimeData *data = d->model->mimeData(indexes);
        if (!data)
            return;
        QRect rect;
        QPixmap pixmap = d->renderToPixmap(indexes, &rect);
        rect.adjust(horizontalOffset(), verticalOffset(), 0, 0);
        QDrag *drag = new QDrag(this);
        drag->setPixmap(pixmap);
        drag->setMimeData(data);
        drag->setHotSpot(d->pressedPosition - rect.topLeft());
        Qt::DropAction defaultDropAction = Qt::IgnoreAction;
        if (dragDropMode() == InternalMove)
            supportedActions &= ~Qt::CopyAction;
        if (d->defaultDropAction != Qt::IgnoreAction && (supportedActions & d->defaultDropAction))
            defaultDropAction = d->defaultDropAction;
        else if (supportedActions & Qt::CopyAction && dragDropMode() != QAbstractItemView::InternalMove)
            defaultDropAction = Qt::CopyAction;
        d->dropEventMoved = false;
        if (drag->exec(supportedActions, defaultDropAction) == Qt::MoveAction && !d->dropEventMoved) {
            if (dragDropMode() != InternalMove || drag->target() == viewport())
                d->clearOrRemove();
        }
        d->dropEventMoved = false;
        // Reset the drop indicator
        d->dropIndicatorRect = QRect();
        d->dropIndicatorPosition = OnItem;
    }
}